

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_truncate(Pager *pPager,Pgno nPage)

{
  sqlite3_io_methods *psVar1;
  i64 iVar2;
  char *__s;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  i64 currentSize;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_30;
  size_t __n;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = pPager->fd->pMethods;
  iVar3 = 0;
  if ((psVar1 == (sqlite3_io_methods *)0x0) || (iVar3 = 0, 0xfc < (byte)(pPager->eState - 4)))
  goto LAB_0013bc1d;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = pPager->pageSize;
  iVar3 = (*psVar1->xFileSize)(pPager->fd,(sqlite3_int64 *)&local_38);
  iVar4 = (int)iVar2;
  __n = (size_t)iVar4;
  local_40 = (undefined1 *)(nPage * __n);
  if (iVar3 != 0) goto LAB_0013bc1d;
  iVar3 = 0;
  if (local_38 == local_40) goto LAB_0013bc1d;
  if ((long)local_40 < (long)local_38) {
    iVar3 = (*pPager->fd->pMethods->xTruncate)(pPager->fd,(sqlite3_int64)local_40);
LAB_0013bc13:
    if (iVar3 != 0) goto LAB_0013bc1d;
  }
  else if ((long)(local_38 + __n) <= (long)local_40) {
    __s = pPager->pTmpSpace;
    memset(__s,0,__n);
    (*pPager->fd->pMethods->xFileControl)(pPager->fd,5,&local_40);
    iVar3 = (*pPager->fd->pMethods->xWrite)(pPager->fd,__s,iVar4,(long)local_40 - __n);
    goto LAB_0013bc13;
  }
  pPager->dbFileSize = nPage;
  iVar3 = 0;
LAB_0013bc1d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );
  PAGERTRACE(("Truncate %d npage %u\n", PAGERID(pPager), nPage));


  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_SIZE_HINT, &newSize);
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}